

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

sftp_request * sftp_find_request(sftp_packet *pktin)

{
  unsigned_long uVar1;
  sftp_request *e;
  uint id;
  undefined4 local_c;
  
  if (pktin != (sftp_packet *)0x0) {
    uVar1 = BinarySource_get_uint32(pktin->binarysource_);
    local_c = (undefined4)uVar1;
    if (pktin->binarysource_[0].err == BSE_NO_ERROR) {
      e = (sftp_request *)find234(sftp_requests,&local_c,sftp_reqfind);
      if ((e != (sftp_request *)0x0) && (e->registered != false)) {
        del234(sftp_requests,e);
        return e;
      }
      fxp_error_message = "request ID mismatch\n";
      fxp_errtype = -1;
      return (sftp_request *)0x0;
    }
  }
  fxp_errtype = -1;
  fxp_error_message = "did not receive a valid SFTP packet\n";
  return (sftp_request *)0x0;
}

Assistant:

struct sftp_request *sftp_find_request(struct sftp_packet *pktin)
{
    unsigned id;
    struct sftp_request *req;

    if (!pktin) {
        fxp_internal_error("did not receive a valid SFTP packet\n");
        return NULL;
    }

    id = get_uint32(pktin);
    if (get_err(pktin)) {
        fxp_internal_error("did not receive a valid SFTP packet\n");
        return NULL;
    }

    req = find234(sftp_requests, &id, sftp_reqfind);
    if (!req || !req->registered) {
        fxp_internal_error("request ID mismatch\n");
        return NULL;
    }

    del234(sftp_requests, req);

    return req;
}